

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O0

int acmod_read_scores_internal(acmod_t *acmod)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  int local_3c;
  int sen;
  int j;
  int n;
  int i;
  size_t rv;
  FILE *pFStack_20;
  int16 n_active;
  FILE *senfh;
  acmod_t *acmod_local;
  
  pFStack_20 = (FILE *)acmod->insenfh;
  senfh = (FILE *)acmod;
  if (acmod->n_feat_frame == acmod->n_feat_alloc) {
    if (acmod->grow_feat == '\0') {
      return 0;
    }
    acmod_grow_feat_buf(acmod,acmod->n_feat_alloc << 1);
  }
  if (pFStack_20 != (FILE *)0x0) {
    sVar3 = fread((void *)((long)&rv + 6),2,1,pFStack_20);
    if (sVar3 == 1) {
      *(int *)((long)&senfh->_markers + 4) = (int)rv._6_2_;
      if (*(int *)((long)&senfh->_markers + 4) == *(int *)(senfh->_IO_write_ptr + 0x14)) {
        sVar3 = fread(senfh->_IO_save_base,2,(long)*(int *)((long)&senfh->_markers + 4),pFStack_20);
        if (sVar3 == (long)*(int *)((long)&senfh->_markers + 4)) {
          return 1;
        }
      }
      else {
        sVar3 = fread(senfh->_IO_save_end,1,(long)*(int *)((long)&senfh->_markers + 4),pFStack_20);
        if (sVar3 == (long)*(int *)((long)&senfh->_markers + 4)) {
          j = 0;
          sen = 0;
          while( true ) {
            if (*(int *)((long)&senfh->_markers + 4) <= j) {
              while (sen = sen + 1, sen < *(int *)(senfh->_IO_write_ptr + 0x14)) {
                pcVar1 = senfh->_IO_save_base;
                (pcVar1 + (long)sen * 2)[0] = -1;
                (pcVar1 + (long)sen * 2)[1] = '\x7f';
              }
              return 1;
            }
            iVar2 = sen + (uint)(byte)senfh->_IO_save_end[j];
            while (local_3c = sen + 1, local_3c < iVar2) {
              pcVar1 = senfh->_IO_save_base;
              (pcVar1 + (long)local_3c * 2)[0] = -1;
              (pcVar1 + (long)local_3c * 2)[1] = '\x7f';
              sen = local_3c;
            }
            sVar3 = fread(senfh->_IO_save_base + (long)iVar2 * 2,2,1,pFStack_20);
            if (sVar3 != 1) break;
            j = j + 1;
            sen = iVar2;
          }
        }
      }
    }
    iVar2 = ferror(pFStack_20);
    if (iVar2 == 0) {
      acmod_local._4_4_ = 0;
    }
    else {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                     ,0x3d0,"Failed to read frame from senone file");
      acmod_local._4_4_ = -1;
    }
    return acmod_local._4_4_;
  }
  return -1;
}

Assistant:

static int
acmod_read_scores_internal(acmod_t *acmod)
{
    FILE *senfh = acmod->insenfh;
    int16 n_active;
    size_t rv;

    if (acmod->n_feat_frame == acmod->n_feat_alloc) {
        if (acmod->grow_feat)
            acmod_grow_feat_buf(acmod, acmod->n_feat_alloc * 2);
        else
            return 0;
    }

    if (senfh == NULL)
        return -1;
    
    if ((rv = fread(&n_active, 2, 1, senfh)) != 1)
        goto error_out;

    acmod->n_senone_active = n_active;
    if (acmod->n_senone_active == bin_mdef_n_sen(acmod->mdef)) {
        if ((rv = fread(acmod->senone_scores, 2,
                        acmod->n_senone_active, senfh))
            != (size_t) acmod->n_senone_active)
            goto error_out;
    }
    else {
        int i, n;
        
        if ((rv = fread(acmod->senone_active, 1,
                        acmod->n_senone_active, senfh))
            != (size_t) acmod->n_senone_active)
            goto error_out;

        for (i = 0, n = 0; i < acmod->n_senone_active; ++i) {
            int j, sen = n + acmod->senone_active[i];
            for (j = n + 1; j < sen; ++j)
                acmod->senone_scores[j] = SENSCR_DUMMY;
            
            if ((rv = fread(acmod->senone_scores + sen, 2, 1, senfh)) != 1)
                goto error_out;
            
            n = sen;
        }

        n++;
        while (n < bin_mdef_n_sen(acmod->mdef))
            acmod->senone_scores[n++] = SENSCR_DUMMY;
    }
    return 1;

error_out:
    if (ferror(senfh)) {
        E_ERROR_SYSTEM("Failed to read frame from senone file");
        return -1;
    }
    return 0;
}